

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::find_content_type
                   (string *__return_storage_ptr__,string *path,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *user_data,string *default_content_type)

{
  uint uVar1;
  const_iterator cVar2;
  string ext;
  allocator<char> local_41;
  string local_40;
  
  file_extension(&local_40,path);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&user_data->_M_t,&local_40);
  if ((_Rb_tree_header *)cVar2._M_node != &(user_data->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,*(char **)(cVar2._M_node + 2),&local_41);
    goto LAB_0014225c;
  }
  uVar1 = str2tag(&local_40);
  if (uVar1 == 0x76d) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"application/x-7z-compressed",&local_41);
    goto LAB_0014225c;
  }
  if (uVar1 == 0xd3d) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"application/gzip",&local_41);
    goto LAB_0014225c;
  }
  if (uVar1 != 0xdd9) {
    if (uVar1 == 0x1a2c3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"text/css",&local_41);
      goto LAB_0014225c;
    }
    if (uVar1 == 0x1a2c6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"text/csv",&local_41);
      goto LAB_0014225c;
    }
    if (uVar1 == 0x1a6df) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"image/bmp",&local_41);
      goto LAB_0014225c;
    }
    if (uVar1 == 0x1b0f1) {
LAB_001424aa:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"text/html",&local_41);
      goto LAB_0014225c;
    }
    if (uVar1 == 0x1b288) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"image/gif",&local_41);
      goto LAB_0014225c;
    }
    if (uVar1 == 0x1c97d) {
LAB_00142478:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"image/jpeg",&local_41);
      goto LAB_0014225c;
    }
    if (uVar1 == 0x1cb45) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"image/x-icon",&local_41);
      goto LAB_0014225c;
    }
    if (uVar1 == 0x1d0f2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"application/pdf",&local_41);
      goto LAB_0014225c;
    }
    if (uVar1 == 0x1d1b9) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"image/png",&local_41);
      goto LAB_0014225c;
    }
    if (uVar1 == 0x1d5fd) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"font/otf",&local_41);
      goto LAB_0014225c;
    }
    if (uVar1 != 0x1db34) {
      if (uVar1 == 0x1de29) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"video/mp4",&local_41);
        goto LAB_0014225c;
      }
      if (uVar1 == 0x1de2e) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"audio/mp3",&local_41);
        goto LAB_0014225c;
      }
      if (uVar1 == 0x1dee6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"font/ttf",&local_41);
        goto LAB_0014225c;
      }
      if (uVar1 == 0x1e078) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"text/plain",&local_41);
        goto LAB_0014225c;
      }
      if (uVar1 == 0x1e147) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"application/x-tar",&local_41);
        goto LAB_0014225c;
      }
      if (uVar1 == 0x1e25b) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"image/tiff",&local_41);
        goto LAB_0014225c;
      }
      if (uVar1 == 0x1e322) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"image/svg+xml",&local_41);
        goto LAB_0014225c;
      }
      if (uVar1 == 0x1e692) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"application/rss+xml",&local_41);
        goto LAB_0014225c;
      }
      if (uVar1 != 0x1f164) {
        if (uVar1 == 0x1f1d9) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"application/xml",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x1f580) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"audio/wave",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x1f7f6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"text/vtt",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x20a43) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"application/zip",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x371b38) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"image/apng",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x372318) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"image/avif",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x372b57) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"application/atom+xml",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x37cf7d) goto LAB_001424aa;
        if (uVar1 == 0x3adb38) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"application/json",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x3af938) goto LAB_00142478;
        if (uVar1 == 0x3dad1f) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"video/mpeg",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x3daddb) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"audio/mpeg",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x3e2ddd) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"image/tiff",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x3ff093) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"application/xslt+xml",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x409760) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"image/webp",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x409771) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"audio/webm",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x40977d) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"video/webm",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x40a648) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"application/wasm",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 == 0x40c278) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"font/woff",&local_41);
          goto LAB_0014225c;
        }
        if (uVar1 != 0x43cec5) {
          if (uVar1 == 0x59114a) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"font/woff2",&local_41);
          }
          else {
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,(string *)default_content_type);
          }
          goto LAB_0014225c;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"application/xhtml+xml",&local_41);
      goto LAB_0014225c;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"text/javascript",&local_41);
LAB_0014225c:
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline std::string
find_content_type(const std::string &path,
                  const std::map<std::string, std::string> &user_data,
                  const std::string &default_content_type) {
  auto ext = file_extension(path);

  auto it = user_data.find(ext);
  if (it != user_data.end()) { return it->second.c_str(); }

  using udl::operator""_t;

  switch (str2tag(ext)) {
  default: return default_content_type;

  case "css"_t: return "text/css";
  case "csv"_t: return "text/csv";
  case "htm"_t:
  case "html"_t: return "text/html";
  case "js"_t:
  case "mjs"_t: return "text/javascript";
  case "txt"_t: return "text/plain";
  case "vtt"_t: return "text/vtt";

  case "apng"_t: return "image/apng";
  case "avif"_t: return "image/avif";
  case "bmp"_t: return "image/bmp";
  case "gif"_t: return "image/gif";
  case "png"_t: return "image/png";
  case "svg"_t: return "image/svg+xml";
  case "webp"_t: return "image/webp";
  case "ico"_t: return "image/x-icon";
  case "tif"_t: return "image/tiff";
  case "tiff"_t: return "image/tiff";
  case "jpg"_t:
  case "jpeg"_t: return "image/jpeg";

  case "mp4"_t: return "video/mp4";
  case "mpeg"_t: return "video/mpeg";
  case "webm"_t: return "video/webm";

  case "mp3"_t: return "audio/mp3";
  case "mpga"_t: return "audio/mpeg";
  case "weba"_t: return "audio/webm";
  case "wav"_t: return "audio/wave";

  case "otf"_t: return "font/otf";
  case "ttf"_t: return "font/ttf";
  case "woff"_t: return "font/woff";
  case "woff2"_t: return "font/woff2";

  case "7z"_t: return "application/x-7z-compressed";
  case "atom"_t: return "application/atom+xml";
  case "pdf"_t: return "application/pdf";
  case "json"_t: return "application/json";
  case "rss"_t: return "application/rss+xml";
  case "tar"_t: return "application/x-tar";
  case "xht"_t:
  case "xhtml"_t: return "application/xhtml+xml";
  case "xslt"_t: return "application/xslt+xml";
  case "xml"_t: return "application/xml";
  case "gz"_t: return "application/gzip";
  case "zip"_t: return "application/zip";
  case "wasm"_t: return "application/wasm";
  }
}